

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O1

void __thiscall
QtPrivate::QPodArrayOps<QTzTransitionTime>::emplace<QTzTransitionTime_const&>
          (QPodArrayOps<QTzTransitionTime> *this,qsizetype i,QTzTransitionTime *args)

{
  QTzTransitionTime **ppQVar1;
  qsizetype *pqVar2;
  Data *pDVar3;
  long lVar4;
  qint64 qVar5;
  quint8 qVar6;
  undefined7 uVar7;
  QTzTransitionTime *pQVar8;
  GrowthPosition where;
  
  pDVar3 = (this->super_QArrayDataPointer<QTzTransitionTime>).d;
  if ((pDVar3 == (Data *)0x0) ||
     (1 < (pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i)) {
LAB_00410e17:
    qVar5 = args->atMSecsSinceEpoch;
    qVar6 = args->ruleIndex;
    uVar7 = *(undefined7 *)&args->field_0x9;
    where = (GrowthPosition)(i == 0 && (this->super_QArrayDataPointer<QTzTransitionTime>).size != 0)
    ;
    QArrayDataPointer<QTzTransitionTime>::detachAndGrow
              (&this->super_QArrayDataPointer<QTzTransitionTime>,where,1,(QTzTransitionTime **)0x0,
               (QArrayDataPointer<QTzTransitionTime> *)0x0);
    pQVar8 = createHole(this,where,i,1);
    pQVar8->atMSecsSinceEpoch = qVar5;
    pQVar8->ruleIndex = qVar6;
    *(undefined7 *)&pQVar8->field_0x9 = uVar7;
  }
  else {
    lVar4 = (this->super_QArrayDataPointer<QTzTransitionTime>).size;
    if ((lVar4 == i && pDVar3 != (Data *)0x0) &&
       ((pDVar3->super_QArrayData).alloc !=
        ((long)((long)(this->super_QArrayDataPointer<QTzTransitionTime>).ptr -
               ((ulong)((long)&pDVar3[1].super_QArrayData.alloc + 7U) & 0xfffffffffffffff0)) >> 4) +
        lVar4)) {
      qVar6 = args->ruleIndex;
      uVar7 = *(undefined7 *)&args->field_0x9;
      pQVar8 = (this->super_QArrayDataPointer<QTzTransitionTime>).ptr + lVar4;
      pQVar8->atMSecsSinceEpoch = args->atMSecsSinceEpoch;
      pQVar8->ruleIndex = qVar6;
      *(undefined7 *)&pQVar8->field_0x9 = uVar7;
    }
    else {
      if (((i != 0) || (pDVar3 == (Data *)0x0)) ||
         ((QTzTransitionTime *)
          ((ulong)((long)&pDVar3[1].super_QArrayData.alloc + 7U) & 0xfffffffffffffff0) ==
          (this->super_QArrayDataPointer<QTzTransitionTime>).ptr)) goto LAB_00410e17;
      pQVar8 = (this->super_QArrayDataPointer<QTzTransitionTime>).ptr;
      qVar6 = args->ruleIndex;
      uVar7 = *(undefined7 *)&args->field_0x9;
      pQVar8[-1].atMSecsSinceEpoch = args->atMSecsSinceEpoch;
      pQVar8[-1].ruleIndex = qVar6;
      *(undefined7 *)&pQVar8[-1].field_0x9 = uVar7;
      ppQVar1 = &(this->super_QArrayDataPointer<QTzTransitionTime>).ptr;
      *ppQVar1 = *ppQVar1 + -1;
    }
    pqVar2 = &(this->super_QArrayDataPointer<QTzTransitionTime>).size;
    *pqVar2 = *pqVar2 + 1;
  }
  return;
}

Assistant:

void emplace(qsizetype i, Args &&... args)
    {
        bool detach = this->needsDetach();
        if (!detach) {
            if (i == this->size && this->freeSpaceAtEnd()) {
                new (this->end()) T(std::forward<Args>(args)...);
                ++this->size;
                return;
            }
            if (i == 0 && this->freeSpaceAtBegin()) {
                new (this->begin() - 1) T(std::forward<Args>(args)...);
                --this->ptr;
                ++this->size;
                return;
            }
        }
        T tmp(std::forward<Args>(args)...);
        typename QArrayData::GrowthPosition pos = QArrayData::GrowsAtEnd;
        if (this->size != 0 && i == 0)
            pos = QArrayData::GrowsAtBeginning;

        this->detachAndGrow(pos, 1, nullptr, nullptr);

        T *where = createHole(pos, i, 1);
        new (where) T(std::move(tmp));
    }